

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

FunctionInfo * __thiscall
Js::DynamicProfileInfo::GetCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          bool *isConstructorCall,bool *isPolymorphicCall)

{
  SourceId sourceId_00;
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  CallSiteInfo **ppCVar6;
  LocalFunctionId functionId;
  SourceId sourceId;
  ProfileId callSiteCount;
  bool *isPolymorphicCall_local;
  bool *isConstructorCall_local;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x464,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x465,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar3 = FunctionBody::GetProfiledCallSiteCount(functionBody);
  if (PVar3 <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x467,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = FunctionProxy::IsJsBuiltInCode((FunctionProxy *)functionBody);
  if (!bVar2) {
    bVar2 = FunctionProxy::IsPublicLibraryCode((FunctionProxy *)functionBody);
    if (!bVar2) {
      bVar2 = HasCallSiteInfo(functionBody);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                    ,0x468,
                                    "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                    ,
                                    "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  *isConstructorCall = (*(ushort *)&(*ppCVar6)[callSiteId].field_0x2 >> 0xd & 1) != 0;
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  if ((*(ushort *)&(*ppCVar6)[callSiteId].field_0x2 >> 0xe & 1) == 0) {
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    if (*(short *)&(*ppCVar6)[callSiteId].field_0x2 < 0) {
      *isPolymorphicCall = true;
      this_local = (DynamicProfileInfo *)0x0;
    }
    else {
      ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      sourceId_00 = (*ppCVar6)[callSiteId].u.functionData.sourceId;
      ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      this_local = (DynamicProfileInfo *)
                   GetFunctionInfo(functionBody,sourceId_00,
                                   (*ppCVar6)[callSiteId].u.functionData.functionId);
    }
  }
  else {
    this_local = (DynamicProfileInfo *)0x0;
  }
  return (FunctionInfo *)this_local;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, bool *isConstructorCall, bool *isPolymorphicCall)
    {
        Assert(ThreadContext::GetContextForCurrentThread());
        Assert(functionBody);
        const auto callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));

        *isConstructorCall = callSiteInfo[callSiteId].isConstructorCall;
        if (callSiteInfo[callSiteId].dontInline)
        {
            return nullptr;
        }

        if (!callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId sourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
            Js::LocalFunctionId functionId = callSiteInfo[callSiteId].u.functionData.functionId;
            return GetFunctionInfo(functionBody, sourceId, functionId);
        }
        else
        {
            *isPolymorphicCall = true;
        }
        return nullptr;
    }